

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  pointer pMVar1;
  cmExecutionStatus *pcVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  mode_t *permissions;
  string regex;
  ostringstream e;
  char local_201;
  cmAlphaNum local_200;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [16];
  char local_180 [360];
  
  switch(this->Doing) {
  case 2:
    if ((arg->_M_string_length == 0) || (bVar3 = cmsys::SystemTools::FileIsFullPath(arg), bVar3)) {
      std::__cxx11::string::_M_assign((string *)&this->Destination);
    }
    else {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      local_190._8_8_ = (psVar5->_M_dataplus)._M_p;
      local_190._0_8_ = psVar5->_M_string_length;
      local_200.View_._M_str = local_200.Digits_;
      local_200.View_._M_len = 1;
      local_200.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_1d0,(cmAlphaNum *)local_190,&local_200,arg);
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    break;
  case 3:
    bVar3 = cmsys::SystemTools::FileIsFullPath(arg);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&this->FilesFromDir);
    }
    else {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      local_190._8_8_ = (psVar5->_M_dataplus)._M_p;
      local_190._0_8_ = psVar5->_M_string_length;
      local_200.View_._M_str = local_200.Digits_;
      local_200.View_._M_len = 1;
      local_200.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_1d0,(cmAlphaNum *)local_190,&local_200,arg);
      std::__cxx11::string::operator=((string *)&this->FilesFromDir,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&this->FilesFromDir);
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,arg);
    return true;
  case 5:
    local_190._8_8_ = local_180;
    local_190._0_8_ = (_func_int **)0x1;
    local_180[0] = '/';
    cmsys::Glob::PatternToRegex(&local_1b0,arg,false,false);
    local_200.View_._M_len = local_1b0._M_string_length;
    local_200.View_._M_str = local_1b0._M_dataplus._M_p;
    local_201 = '$';
    cmStrCat<char>(&local_1d0,(cmAlphaNum *)local_190,&local_200,&local_201);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,&local_1d0);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar4 = std::operator<<((ostream *)local_190,"could not compile PATTERN \"");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\".");
      pcVar2 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
      std::__cxx11::string::~string((string *)&local_200);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    }
    else {
      this->Doing = 0;
    }
    std::__cxx11::string::~string((string *)&local_1d0);
    return true;
  case 6:
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,arg);
    pMVar1 = (this->MatchRules).
             super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->CurrentMatchRule = pMVar1 + -1;
    if (pMVar1[-1].Regex.program == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      poVar4 = std::operator<<((ostream *)local_190,"could not compile REGEX \"");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      std::operator<<(poVar4,"\".");
      pcVar2 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar2->Error);
      std::__cxx11::string::~string((string *)&local_200);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      return true;
    }
    break;
  case 7:
    permissions = &this->FilePermissions;
    goto LAB_003678cd;
  case 8:
    permissions = &this->DirPermissions;
    goto LAB_003678cd;
  case 9:
    permissions = &(this->CurrentMatchRule->Properties).Permissions;
LAB_003678cd:
    bVar3 = CheckPermissions(this,arg,permissions);
    if (!bVar3) {
      this->Doing = 1;
      return true;
    }
    return true;
  default:
    return false;
  }
  this->Doing = 0;
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch (this->Doing) {
    case DoingFiles:
      this->Files.push_back(arg);
      break;
    case DoingDestination:
      if (arg.empty() || cmSystemTools::FileIsFullPath(arg)) {
        this->Destination = arg;
      } else {
        this->Destination =
          cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/', arg);
      }
      this->Doing = DoingNone;
      break;
    case DoingFilesFromDir:
      if (cmSystemTools::FileIsFullPath(arg)) {
        this->FilesFromDir = arg;
      } else {
        this->FilesFromDir =
          cmStrCat(this->Makefile->GetCurrentSourceDirectory(), '/', arg);
      }
      cmSystemTools::ConvertToUnixSlashes(this->FilesFromDir);
      this->Doing = DoingNone;
      break;
    case DoingPattern: {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex =
        cmStrCat('/', cmsys::Glob::PatternToRegex(arg, false), '$');
      this->MatchRules.emplace_back(regex);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->Status.SetError(e.str());
        this->Doing = DoingError;
      }
    } break;
    case DoingRegex:
      this->MatchRules.emplace_back(arg);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->Status.SetError(e.str());
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsFile:
      if (!this->CheckPermissions(arg, this->FilePermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsDir:
      if (!this->CheckPermissions(arg, this->DirPermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsMatch:
      if (!this->CheckPermissions(
            arg, this->CurrentMatchRule->Properties.Permissions)) {
        this->Doing = DoingError;
      }
      break;
    default:
      return false;
  }
  return true;
}